

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O3

JsErrorCode JsIsConstructor(JsValueRef object,bool *isConstructor)

{
  ScriptContext *scriptContext;
  ScriptContext *pSVar1;
  bool bVar2;
  JsErrorCode JVar3;
  BOOL BVar4;
  JsrtContext *currentContext;
  RecyclableObject *value;
  AutoNestedHandledExceptionType local_48 [2];
  TTDebuggerAbortException anon_var_0;
  
  currentContext = JsrtContext::GetCurrent();
  JVar3 = CheckContext(currentContext,false,false);
  if (JVar3 != JsNoError) {
    return JVar3;
  }
  scriptContext =
       (((currentContext->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (local_48,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
  if (object == (JsValueRef)0x0) {
    JVar3 = JsErrorInvalidArgument;
  }
  else {
    BVar4 = Js::JavascriptOperators::IsObject(object);
    if (BVar4 == 0) {
      JVar3 = JsErrorArgumentNotObject;
    }
    else {
      value = Js::VarTo<Js::RecyclableObject>(object);
      pSVar1 = (((((value->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
               scriptContext.ptr;
      if (pSVar1 != scriptContext) {
        JVar3 = JsErrorWrongRuntime;
        if (pSVar1->threadContext != scriptContext->threadContext) goto LAB_003ca7e8;
        object = Js::CrossSite::MarshalVar(scriptContext,value,false);
      }
      if (isConstructor == (bool *)0x0) {
        JVar3 = JsErrorNullArgument;
      }
      else {
        bVar2 = Js::JavascriptOperators::IsConstructor(object);
        *isConstructor = bVar2;
        JVar3 = JsNoError;
      }
    }
  }
LAB_003ca7e8:
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_48);
  return JVar3;
}

Assistant:

CHAKRA_API JsIsConstructor(_In_ JsValueRef object, _Out_ bool *isConstructor)
{
    return ContextAPINoScriptWrapper_NoRecord([&](Js::ScriptContext *scriptContext) -> JsErrorCode {
        VALIDATE_INCOMING_OBJECT(object, scriptContext);
        PARAM_NOT_NULL(isConstructor);

        *isConstructor = Js::JavascriptOperators::IsConstructor(object);

        return JsNoError;
    });
}